

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::standard_reporter::~standard_reporter(standard_reporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  
  (this->super_reporter)._vptr_reporter = (_func_int **)&PTR__standard_reporter_0020b9b8;
  pcVar3 = (this->current)._M_dataplus._M_p;
  paVar1 = &(this->current).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_reporter)._vptr_reporter = (_func_int **)&PTR__reporter_0020ba98;
  p_Var4 = (this->super_reporter).os.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pfVar2 = &(this->super_reporter).os;
    (*p_Var4)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

std::string description() override {
            return "the standard reporter";
        }